

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

Expression * __thiscall
EOPlus::Parser::ParseExpression(Expression *__return_storage_ptr__,Parser *this)

{
  initializer_list<util::variant> __l;
  bool bVar1;
  int iVar2;
  Parser_Error *pPVar3;
  pointer pPVar4;
  Token *t_00;
  Token *t_01;
  Token *t_02;
  Token *t_03;
  variant *local_680;
  Token local_650;
  string local_600;
  allocator<char> local_5d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  undefined1 local_571;
  Token local_570;
  string local_520;
  allocator<char> local_4f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  undefined1 local_491;
  Token local_490;
  string local_440;
  allocator<char> local_419;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  anon_class_1_0_00000001 local_3b1;
  function<bool_(const_EOPlus::Token_&)> local_3b0;
  undefined4 local_390;
  anon_class_1_0_00000001 local_389;
  function<bool_(const_EOPlus::Token_&)> local_388;
  anon_class_1_0_00000001 local_361;
  function<bool_(const_EOPlus::Token_&)> local_360;
  string local_340;
  deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> local_320;
  undefined1 local_2c9;
  Token local_2c8;
  string local_278;
  allocator<char> local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1e9;
  string local_1e8;
  variant *local_1c8;
  variant local_1c0;
  iterator local_180;
  double local_178;
  variant local_170;
  undefined1 local_130 [8];
  Token tt;
  variant local_b0;
  undefined1 local_70 [8];
  Token t;
  Parser *this_local;
  Expression *expression;
  
  t._79_1_ = 0;
  Expression::Expression(__return_storage_ptr__);
  util::variant::variant(&local_b0);
  Token::Token((Token *)local_70,Invalid,&local_b0);
  util::variant::~variant(&local_b0);
  bVar1 = GetToken(this,(Token *)local_70,1);
  if (bVar1) {
    util::variant::operator_cast_to_string((string *)&tt.newlines,(variant *)&t);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &tt.newlines,"goto");
    std::__cxx11::string::~string((string *)&tt.newlines);
    if (bVar1) {
      util::variant::variant(&local_170);
      Token::Token((Token *)local_130,Invalid,&local_170);
      util::variant::~variant(&local_170);
      bVar1 = GetToken(this,(Token *)local_130,1);
      if (!bVar1) {
        local_2c9 = 1;
        pPVar3 = (Parser_Error *)__cxa_allocate_exception(0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_250,"Expected identifier after \'goto\'.",&local_251);
        std::operator+(&local_230,&local_250," Got: ");
        pPVar4 = std::
                 unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ::operator->(&this->tok);
        Parser_Token_Server_Base::RejectToken(&local_2c8,pPVar4);
        token_got_string_abi_cxx11_(&local_278,(EOPlus *)&local_2c8,t_00);
        std::operator+(&local_210,&local_230,&local_278);
        pPVar4 = std::
                 unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ::operator->(&this->tok);
        iVar2 = Parser_Token_Server_Base::RejectLine(pPVar4);
        Parser_Error::Parser_Error(pPVar3,&local_210,iVar2);
        local_2c9 = 0;
        __cxa_throw(pPVar3,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
      }
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->function,"setstate");
      local_1e9 = 1;
      local_1c8 = &local_1c0;
      util::variant::operator_cast_to_string(&local_1e8,(variant *)&tt);
      util::variant::variant(&local_1c0,&local_1e8);
      local_1e9 = 0;
      local_180 = &local_1c0;
      local_178 = 4.94065645841247e-324;
      __l._M_len = 1;
      __l._M_array = local_180;
      std::deque<util::variant,_std::allocator<util::variant>_>::operator=
                (&__return_storage_ptr__->args,__l);
      local_680 = (variant *)&local_180;
      do {
        local_680 = local_680 + -1;
        util::variant::~variant(local_680);
      } while (local_680 != &local_1c0);
      std::__cxx11::string::~string((string *)&local_1e8);
      Token::~Token((Token *)local_130);
    }
    else {
      ParseScopes(&local_320,this);
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::operator=
                (&__return_storage_ptr__->scopes,&local_320);
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque(&local_320);
      util::variant::operator_cast_to_string(&local_340,(variant *)&t);
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->function,(string *)&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      std::function<bool(EOPlus::Token_const&)>::
      function<EOPlus::Parser::ParseExpression()::__0,void>
                ((function<bool(EOPlus::Token_const&)> *)&local_360,&local_361);
      bVar1 = GetTokenIf(this,(Token *)local_70,&local_360,0x20);
      std::function<bool_(const_EOPlus::Token_&)>::~function(&local_360);
      if (!bVar1) {
        pPVar3 = (Parser_Error *)__cxa_allocate_exception(0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5d8,"Expected \'(\' after function-name.",&local_5d9);
        std::operator+(&local_5b8,&local_5d8," Got: ");
        pPVar4 = std::
                 unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ::operator->(&this->tok);
        Parser_Token_Server_Base::RejectToken(&local_650,pPVar4);
        token_got_string_abi_cxx11_(&local_600,(EOPlus *)&local_650,t_03);
        std::operator+(&local_598,&local_5b8,&local_600);
        pPVar4 = std::
                 unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ::operator->(&this->tok);
        iVar2 = Parser_Token_Server_Base::RejectLine(pPVar4);
        Parser_Error::Parser_Error(pPVar3,&local_598,iVar2);
        __cxa_throw(pPVar3,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
      }
      std::function<bool(EOPlus::Token_const&)>::
      function<EOPlus::Parser::ParseExpression()::__1,void>
                ((function<bool(EOPlus::Token_const&)> *)&local_388,&local_389);
      bVar1 = GetTokenIf(this,(Token *)local_70,&local_388,0x20);
      std::function<bool_(const_EOPlus::Token_&)>::~function(&local_388);
      if (!bVar1) {
        do {
          bVar1 = GetToken(this,(Token *)local_70,0xe);
          if (!bVar1) {
            local_571 = 1;
            pPVar3 = (Parser_Error *)__cxa_allocate_exception(0x18);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4f8,"Expected function-argument in function-argument-list.",
                       &local_4f9);
            std::operator+(&local_4d8,&local_4f8," Got: ");
            pPVar4 = std::
                     unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     ::operator->(&this->tok);
            Parser_Token_Server_Base::RejectToken(&local_570,pPVar4);
            token_got_string_abi_cxx11_(&local_520,(EOPlus *)&local_570,t_02);
            std::operator+(&local_4b8,&local_4d8,&local_520);
            pPVar4 = std::
                     unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     ::operator->(&this->tok);
            iVar2 = Parser_Token_Server_Base::RejectLine(pPVar4);
            Parser_Error::Parser_Error(pPVar3,&local_4b8,iVar2);
            local_571 = 0;
            __cxa_throw(pPVar3,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
          }
          std::deque<util::variant,_std::allocator<util::variant>_>::push_back
                    (&__return_storage_ptr__->args,(value_type *)&t);
          std::function<bool(EOPlus::Token_const&)>::
          function<EOPlus::Parser::ParseExpression()::__2,void>
                    ((function<bool(EOPlus::Token_const&)> *)&local_3b0,&local_3b1);
          bVar1 = GetTokenIf(this,(Token *)local_70,&local_3b0,0x60);
          std::function<bool_(const_EOPlus::Token_&)>::~function(&local_3b0);
          if (!bVar1) {
            local_491 = 1;
            pPVar3 = (Parser_Error *)__cxa_allocate_exception(0x18);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_418,
                       "Expected \',\' or \')\' after function-argument in function-argument-list.",
                       &local_419);
            std::operator+(&local_3f8,&local_418," Got: ");
            pPVar4 = std::
                     unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     ::operator->(&this->tok);
            Parser_Token_Server_Base::RejectToken(&local_490,pPVar4);
            token_got_string_abi_cxx11_(&local_440,(EOPlus *)&local_490,t_01);
            std::operator+(&local_3d8,&local_3f8,&local_440);
            pPVar4 = std::
                     unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     ::operator->(&this->tok);
            iVar2 = Parser_Token_Server_Base::RejectLine(pPVar4);
            Parser_Error::Parser_Error(pPVar3,&local_3d8,iVar2);
            local_491 = 0;
            __cxa_throw(pPVar3,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
          }
          iVar2 = util::variant::operator_cast_to_int((variant *)&t);
        } while (iVar2 != 9);
      }
    }
  }
  t._79_1_ = 1;
  local_390 = 1;
  Token::~Token((Token *)local_70);
  if ((t._79_1_ & 1) == 0) {
    Expression::~Expression(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Expression Parser::ParseExpression()
	{
		Expression expression;
		Token t;

		if (this->GetToken(t, Token::Identifier))
		{
			if (std::string(t.data) == "goto")
			{
				Token tt;

				if (this->GetToken(tt, Token::Identifier))
				{
					expression.function = "setstate";
					expression.args = {std::string(tt.data)};
				}
				else
				{
					PARSER_ERROR_GOT("Expected identifier after 'goto'.");
				}
			}
			else
			{
				expression.scopes = this->ParseScopes();
				expression.function = std::string(t.data);

				if (this->GetTokenIf(t, [](const Token& t) { return int(t.data) == UOP1('('); }, Token::Operator))
				{
					if (this->GetTokenIf(t, [](const Token& t) { return int(t.data) == UOP1(')'); }, Token::Operator))
					{
						return expression;
					}

					while (this->GetToken(t, Token::String | Token::Float | Token::Integer))
					{
						expression.args.push_back(t.data);

						if (this->GetTokenIf(t, [](const Token& t)
						{
							return ((t.type == Token::Symbol && std::string(t.data) == ",")
							     || (t.type == Token::Operator && int(t.data) == UOP1(')')));
						}, Token::Symbol | Token::Operator))
						{
							if (int(t.data) == UOP1(')'))
								return expression;
						}
						else
						{
							PARSER_ERROR_GOT("Expected ',' or ')' after function-argument in function-argument-list.");
						}
					}

					PARSER_ERROR_GOT("Expected function-argument in function-argument-list.");
				}
				else
				{
					PARSER_ERROR_GOT("Expected '(' after function-name.");
				}
			}
		}

		return expression;
	}